

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_0::IsExplicitLod(Op opcode)

{
  bool local_9;
  Op opcode_local;
  
  if (((((opcode == OpImageSampleExplicitLod) || (opcode == OpImageSampleDrefExplicitLod)) ||
       (opcode == OpImageSampleProjExplicitLod)) ||
      ((opcode == OpImageSampleProjDrefExplicitLod || (opcode == OpImageSparseSampleExplicitLod))))
     || ((opcode == OpImageSparseSampleDrefExplicitLod ||
         ((opcode == OpImageSparseSampleProjExplicitLod ||
          (opcode == OpImageSparseSampleProjDrefExplicitLod)))))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool IsExplicitLod(spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpImageSampleExplicitLod:
    case spv::Op::OpImageSampleDrefExplicitLod:
    case spv::Op::OpImageSampleProjExplicitLod:
    case spv::Op::OpImageSampleProjDrefExplicitLod:
    case spv::Op::OpImageSparseSampleExplicitLod:
    case spv::Op::OpImageSparseSampleDrefExplicitLod:
    case spv::Op::OpImageSparseSampleProjExplicitLod:
    case spv::Op::OpImageSparseSampleProjDrefExplicitLod:
      return true;
    default:
      break;
  }
  return false;
}